

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

void __thiscall cmELF::~cmELF(cmELF *this)

{
  cmELF *this_local;
  
  if (this->Internal != (cmELFInternal *)0x0) {
    (*this->Internal->_vptr_cmELFInternal[1])();
  }
  std::__cxx11::string::~string((string *)&this->ErrorMessage);
  return;
}

Assistant:

cmELF::~cmELF()
{
  delete this->Internal;
}